

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapLoader.cpp
# Opt level: O2

Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> * __thiscall
MapLoader::loadMap_abi_cxx11_(MapLoader *this)

{
  bool bVar1;
  ostream *poVar2;
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this_00;
  istream *piVar3;
  long lVar4;
  int local_344;
  string nodeName;
  string nodeType;
  string newNeighbor;
  string line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  string local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  ifstream input;
  
  do {
    bVar1 = fileIsValid(this);
  } while (!bVar1);
  poVar2 = std::operator<<((ostream *)&std::cout,"Setting up the game board...");
  std::endl<char,std::char_traits<char>>(poVar2);
  this_00 = (Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)operator_new(0x18);
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Graph
            (this_00,this->nodeCount);
  std::ifstream::ifstream(&input);
  std::ifstream::open((char *)&input,(_Ios_Openmode)(this->filePath)._M_dataplus._M_p);
  std::__cxx11::string::string((string *)&line,"",(allocator *)&nodeName);
  std::__cxx11::string::string((string *)&nodeName,"",(allocator *)&nodeType);
  std::__cxx11::string::string((string *)&nodeType,"",(allocator *)&newNeighbor);
  local_344 = 0;
LAB_00110ef1:
  do {
    piVar3 = std::operator>>((istream *)&input,(string *)&line);
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Graph --------------------------------");
      std::endl<char,std::char_traits<char>>(poVar2);
      Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      toString(&newNeighbor,this_00);
      poVar2 = std::operator<<((ostream *)&std::cout,(string *)&newNeighbor);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string((string *)&newNeighbor);
      this->map = this_00;
      std::__cxx11::string::~string((string *)&nodeType);
      std::__cxx11::string::~string((string *)&nodeName);
      std::__cxx11::string::~string((string *)&line);
      std::ifstream::~ifstream(&input);
      return this->map;
    }
    bVar1 = std::operator==(&line,"@node");
  } while (!bVar1);
  std::__cxx11::string::assign((char *)&nodeName);
  std::__cxx11::string::assign((char *)&nodeType);
  std::operator>>((istream *)&input,(string *)&line);
  std::operator>>((istream *)&input,(string *)&line);
  while( true ) {
    piVar3 = std::operator>>((istream *)&input,(string *)&line);
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
    bVar1 = std::operator!=(&line,"type:");
    if (!bVar1) break;
    std::operator+(&local_258,&nodeName,&line);
    std::operator+(&newNeighbor,&local_258," ");
    std::__cxx11::string::operator=((string *)&nodeName,(string *)&newNeighbor);
    std::__cxx11::string::~string((string *)&newNeighbor);
    std::__cxx11::string::~string((string *)&local_258);
  }
  do {
    piVar3 = std::operator>>((istream *)&input,(string *)&line);
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
    bVar1 = std::operator!=(&line,"adjacent:");
    if (!bVar1) break;
    std::operator+(&newNeighbor,&nodeType,&line);
    std::__cxx11::string::operator=((string *)&nodeType,(string *)&newNeighbor);
    std::__cxx11::string::~string((string *)&newNeighbor);
  } while( true );
  lVar4 = std::__cxx11::string::find_last_not_of((char *)&nodeName,0x11644d);
  std::__cxx11::string::erase((ulong)&nodeName,lVar4 + 1);
  std::__cxx11::string::string((string *)&local_278,(string *)&nodeName);
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  setVertexName(this_00,&local_278,local_344);
  std::__cxx11::string::~string((string *)&local_278);
  poVar2 = std::operator<<((ostream *)&std::cout,"adding vertex name");
  poVar2 = std::operator<<(poVar2,(string *)&nodeName);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::string((string *)&local_298,(string *)&nodeType);
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  setVertexData(this_00,&local_298,local_344);
  std::__cxx11::string::~string((string *)&local_298);
  poVar2 = std::operator<<((ostream *)&std::cout,"adding vertex data");
  poVar2 = std::operator<<(poVar2,(string *)&nodeType);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::string((string *)&newNeighbor,"",(allocator *)&local_258);
  while( true ) {
    piVar3 = std::operator>>((istream *)&input,(string *)&line);
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
    bVar1 = std::operator!=(&line,"}");
    if (!bVar1) break;
    bVar1 = std::operator==(&line,"adjacent:");
    if (bVar1) {
      lVar4 = std::__cxx11::string::find_last_not_of((char *)&newNeighbor,0x11644d);
      std::__cxx11::string::erase((ulong)&newNeighbor,lVar4 + 1);
      std::__cxx11::string::string((string *)&local_2b8,(string *)&newNeighbor);
      Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      addNeighbor(this_00,&local_2b8,local_344);
      std::__cxx11::string::~string((string *)&local_2b8);
      poVar2 = std::operator<<((ostream *)&std::cout,"adding neighbor");
      poVar2 = std::operator<<(poVar2,(string *)&newNeighbor);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::assign((char *)&newNeighbor);
    }
    else {
      std::operator+(&local_258,&line," ");
      std::__cxx11::string::append((string *)&newNeighbor);
      std::__cxx11::string::~string((string *)&local_258);
    }
  }
  local_344 = local_344 + 1;
  std::__cxx11::string::~string((string *)&newNeighbor);
  goto LAB_00110ef1;
}

Assistant:

Graph<string>* MapLoader::loadMap()
{
  //method to load the map file into a graph object

  bool result = false;

  while(!result)
  {

    if(fileIsValid())
    {
      //if the file was valid then we set up the graph object by reading all of the data in the file and assigning nodes
      cout << "Setting up the game board..." << endl;

      Graph<string>* graph = new Graph<string>(nodeCount);

      //we need to reopen the file

      ifstream input; //the input stream associated to out file
      input.open(filePath.c_str()); //try opening the file

      //we already know it is valid so we can start reading right away
      string line = "";
      string nodeName = "";
      string nodeType = "";
      int graphIndex = 0;

      //while we still have readable lines
      while(input >> line)
      {
        //first get the name of the node
        if(line == "@node")
        {
          //wipe the nodeName and nodeType clean
          nodeName = "";
          nodeType = "";

          //if the line is the node declaration
          //then go to the next line and the line after that, where the name field is
          input >> line;
          input >> line;

          //now that we are at the name field we read until we hit adjacent node
          while(input >> line && line != "type:")
          {
            nodeName = nodeName + line + " ";
          }

          //now we need to get the type of node that it is
          while(input >> line && line != "adjacent:")
          {
            nodeType = nodeType + line;
          }

          //since we add a space at the end, we need to trim the right side
          nodeName.erase(nodeName.find_last_not_of(" \n\r\t")+1);
          //now that we have the name of the node, we need to add it to our graph
          graph -> setVertexName(nodeName, graphIndex);
          cout << "adding vertex name" << nodeName << endl;
          graph -> setVertexData(nodeType, graphIndex);
          cout << "adding vertex data" << nodeType << endl;

          //now that we have added the name of the node we need to add every node it is adjacent to to its adjacency list

          string newNeighbor = ""; //the string that will hold the name of the new neighbor to the node

          //while we have not reached a closing brace, keep reading
          while(input >> line && line != "}")
          {
            //if the line contains the word adjacent, then skip that word
            if(line == "adjacent:")
            {
              newNeighbor.erase(newNeighbor.find_last_not_of(" \n\r\t")+1);
              graph -> addNeighbor(newNeighbor, graphIndex); //add the new neighbor
              cout << "adding neighbor" << newNeighbor << endl;
              newNeighbor = ""; //wipe the newNeighbor field and then continue the iteration
              continue;
            }

            else
            {
              newNeighbor += line + " ";
            }
          }

          graphIndex++;
        }
      }
      cout << "Graph --------------------------------" << endl;
      cout << graph->toString() << endl;
      map = graph;
      result = true;
    }

    else
    {
      //if the file was not valid then we need to try again
      result = false;
    }
  }

  return map;

}